

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

void __thiscall
Am_Priority_List::Change_Main_Priority(Am_Priority_List *this,Am_Object *obj,float main_priority)

{
  Am_Priority_List_Item *item_00;
  ostream *poVar1;
  Am_Object local_30;
  Am_Priority_List_Item *local_28;
  Am_Priority_List_Item *item;
  Am_Object *pAStack_18;
  float main_priority_local;
  Am_Object *obj_local;
  Am_Priority_List *this_local;
  
  item._4_4_ = main_priority;
  pAStack_18 = obj;
  obj_local = (Am_Object *)this;
  Am_Object::Am_Object(&local_30,obj);
  item_00 = take_out_obj(this,&local_30);
  Am_Object::~Am_Object(&local_30);
  local_28 = item_00;
  if (item_00 == (Am_Priority_List_Item *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar1 = std::operator<<(poVar1,"Change_Main_Priority for ");
    poVar1 = ::operator<<(poVar1,obj);
    poVar1 = std::operator<<(poVar1," but not on list ");
    poVar1 = ::operator<<(poVar1,this);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  item_00->main_priority = item._4_4_;
  insert_item_at_right_place(this,item_00);
  return;
}

Assistant:

void
Am_Priority_List::Change_Main_Priority(Am_Object obj, float main_priority)
{
  Am_Priority_List_Item *item = this->take_out_obj(obj);
  if (!item) {
    Am_ERRORO("Change_Main_Priority for " << obj << " but not on list "
                                          << *this,
              obj, 0);
  }
  item->main_priority = main_priority;
  this->insert_item_at_right_place(item);
}